

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

XMLSize_t __thiscall
xercesc_4_0::DGXMLScanner::buildAttList
          (DGXMLScanner *this,XMLSize_t attCount,XMLElementDecl *elemDecl,
          RefVectorOf<xercesc_4_0::XMLAttr> *toFill)

{
  ulong uVar1;
  BaseRefVectorOf<xercesc_4_0::XMLAttr> *this_00;
  XMLSize_t XVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  RefHashTableBucketElem<unsigned_int> *pRVar8;
  uint *puVar9;
  XMLCh *pXVar10;
  XMLAttr *this_01;
  XMLCh *pXVar11;
  ulong uVar12;
  RefHashTableBucketElem<unsigned_int> *pRVar13;
  ulong uVar14;
  Codes toEmit;
  XMLValidator *pXVar15;
  AttTypes AVar16;
  undefined4 extraout_var;
  
  iVar3 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[7])(elemDecl);
  if ((attCount == 0 & ((byte)iVar3 ^ 1)) == 0) {
    if ((byte)iVar3 != 0) {
      uVar1 = (toFill->super_BaseRefVectorOf<xercesc_4_0::XMLAttr>).fCurCount;
      iVar3 = (*(elemDecl->super_XSerializable)._vptr_XSerializable[5])(elemDecl);
      plVar5 = (long *)CONCAT44(extraout_var,iVar3);
      lVar6 = (**(code **)(*plVar5 + 0x50))(plVar5);
      if (lVar6 != 0) {
        uVar14 = 0;
        do {
          plVar7 = (long *)(**(code **)(*plVar5 + 0x58))(plVar5,uVar14);
          pRVar8 = this->fAttDefRegistry->fBucketList
                   [(ulong)plVar7 % this->fAttDefRegistry->fHashModulus];
          pRVar13 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          if (pRVar8 != (RefHashTableBucketElem<unsigned_int> *)0x0) {
            do {
              pRVar13 = pRVar8;
              if ((long *)pRVar8->fKey == plVar7) goto LAB_002a047e;
              pRVar8 = pRVar8->fNext;
            } while (pRVar8 != (RefHashTableBucketElem<unsigned_int> *)0x0);
            pRVar13 = (RefHashTableBucketElem<unsigned_int> *)0x0;
          }
LAB_002a047e:
          if (pRVar13 == (RefHashTableBucketElem<unsigned_int> *)0x0) {
            puVar9 = (uint *)0x0;
          }
          else {
            puVar9 = pRVar13->fData;
          }
          if ((puVar9 == (uint *)0x0) || (*puVar9 < this->fElemCount)) {
            uVar4 = *(uint *)(plVar7 + 1);
            if ((this->super_XMLScanner).fValidate == true) {
              if (uVar4 == 2) {
                pXVar15 = (this->super_XMLScanner).fValidator;
                pXVar10 = (XMLCh *)(**(code **)(*plVar7 + 0x28))(plVar7);
                toEmit = RequiredAttrNotProvided;
                pXVar11 = (XMLCh *)0x0;
              }
              else {
                if (((1 < uVar4) || ((this->super_XMLScanner).fStandalone != true)) ||
                   (*(char *)((long)plVar7 + 0x14) != '\x01')) goto LAB_002a053b;
                pXVar15 = (this->super_XMLScanner).fValidator;
                pXVar10 = (XMLCh *)(**(code **)(*plVar7 + 0x28))(plVar7);
                pXVar11 = QName::getRawName(elemDecl->fElementName);
                toEmit = NoDefAttForStandalone;
              }
              XMLValidator::emitError(pXVar15,toEmit,pXVar10,pXVar11,(XMLCh *)0x0,(XMLCh *)0x0);
            }
LAB_002a053b:
            if (uVar4 < 2) {
              if ((this->super_XMLScanner).fValidate == true) {
                pXVar15 = (this->super_XMLScanner).fValidator;
                (*pXVar15->_vptr_XMLValidator[8])(pXVar15,plVar7,plVar7[4]);
              }
              if (attCount < uVar1) {
                this_01 = BaseRefVectorOf<xercesc_4_0::XMLAttr>::elementAt
                                    (&((this->super_XMLScanner).fAttrList)->
                                      super_BaseRefVectorOf<xercesc_4_0::XMLAttr>,attCount);
                if ((this->super_XMLScanner).fDoNamespaces == true) {
                  uVar4 = (this->super_XMLScanner).fEmptyNamespaceId;
                  pXVar11 = (XMLCh *)(**(code **)(*plVar7 + 0x28))(plVar7);
                  pXVar10 = (XMLCh *)plVar7[4];
                  AVar16 = *(AttTypes *)((long)plVar7 + 0xc);
                  QName::setName(this_01->fAttName,pXVar11,uVar4);
                }
                else {
                  pXVar11 = (XMLCh *)(**(code **)(*plVar7 + 0x28))(plVar7);
                  pXVar10 = (XMLCh *)plVar7[4];
                  AVar16 = *(AttTypes *)((long)plVar7 + 0xc);
                  QName::setName(this_01->fAttName,L"",pXVar11,0);
                }
                XMLAttr::setValue(this_01,pXVar10);
                this_01->fType = AVar16;
                this_01->fSpecified = false;
              }
              else {
                if ((this->super_XMLScanner).fDoNamespaces == true) {
                  this_01 = (XMLAttr *)
                            XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
                  uVar4 = (this->super_XMLScanner).fEmptyNamespaceId;
                  pXVar10 = (XMLCh *)(**(code **)(*plVar7 + 0x28))(plVar7);
                  XMLAttr::XMLAttr(this_01,uVar4,pXVar10,(XMLCh *)plVar7[4],
                                   *(AttTypes *)((long)plVar7 + 0xc),false,
                                   (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                                   false);
                }
                else {
                  this_01 = (XMLAttr *)
                            XMemory::operator_new(0x28,(this->super_XMLScanner).fMemoryManager);
                  pXVar10 = (XMLCh *)(**(code **)(*plVar7 + 0x28))(plVar7);
                  XMLAttr::XMLAttr(this_01,0,pXVar10,L"",(XMLCh *)plVar7[4],
                                   *(AttTypes *)((long)plVar7 + 0xc),false,
                                   (this->super_XMLScanner).fMemoryManager,(DatatypeValidator *)0x0,
                                   false);
                }
                this_00 = &((this->super_XMLScanner).fAttrList)->
                           super_BaseRefVectorOf<xercesc_4_0::XMLAttr>;
                BaseRefVectorOf<xercesc_4_0::XMLAttr>::ensureExtraCapacity(this_00,1);
                XVar2 = this_00->fCurCount;
                this_00->fElemList[XVar2] = this_01;
                this_00->fCurCount = XVar2 + 1;
              }
              if ((((this->super_XMLScanner).fDoNamespaces == true) &&
                  (pXVar10 = this_01->fAttName->fPrefix, pXVar10 != (XMLCh *)0x0)) &&
                 (*pXVar10 != L'\0')) {
                uVar4 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar10,Mode_Attribute);
                XMLAttr::setURIId(this_01,uVar4);
              }
              attCount = attCount + 1;
            }
          }
          uVar14 = uVar14 + 1;
          uVar12 = (**(code **)(*plVar5 + 0x50))(plVar5);
        } while (uVar14 < uVar12);
      }
    }
  }
  else {
    attCount = 0;
  }
  return attCount;
}

Assistant:

XMLSize_t
DGXMLScanner::buildAttList(const XMLSize_t              attCount
                          ,       XMLElementDecl*       elemDecl
                          ,       RefVectorOf<XMLAttr>& toFill)
{
    //  Ask the element to clear the 'provided' flag on all of the att defs
    //  that it owns, and to return us a boolean indicating whether it has
    //  any defs.
    const bool hasDefs = elemDecl->hasAttDefs();

    //  If there are no expliclitily provided attributes and there are no
    //  defined attributes for the element, the we don't have anything to do.
    //  So just return zero in this case.
    if (!hasDefs && !attCount)
        return 0;

    // Keep up with how many attrs we end up with total
    XMLSize_t retCount = attCount;

    //  And get the current size of the output vector. This lets us use
    //  existing elements until we fill it, then start adding new ones.
    const XMLSize_t curAttListSize = toFill.size();

    //  Ok, so lets get an enumerator for the attributes of this element
    //  and run through them for well formedness and validity checks. But
    //  make sure that we had any attributes before we do it, since the list
    //  would have have gotten faulted in anyway.
    if (hasDefs)
    {
        XMLAttDefList& attDefList = elemDecl->getAttDefList();
        for(XMLSize_t i=0; i<attDefList.getAttDefCount(); i++)
        {
            // Get the current att def, for convenience and its def type
            XMLAttDef& curDef = attDefList.getAttDef(i);

            unsigned int *attCountPtr = fAttDefRegistry->get(&curDef);
            if (!attCountPtr || *attCountPtr < fElemCount)
            { // did not occur
                const XMLAttDef::DefAttTypes defType = curDef.getDefaultType();

                if (fValidate)
                {
                    // If we are validating and its required, then an error
                    if (defType == XMLAttDef::Required)
                    {
                        fValidator->emitError
                        (
                            XMLValid::RequiredAttrNotProvided
                            , curDef.getFullName()
                        );
                    }
                    else if ((defType == XMLAttDef::Default) ||
		                       (defType == XMLAttDef::Fixed)  )
                    {
                        if (fStandalone && curDef.isExternal())
                        {
                            // XML 1.0 Section 2.9
                            // Document is standalone, so attributes must not be defaulted.
                            fValidator->emitError(XMLValid::NoDefAttForStandalone, curDef.getFullName(), elemDecl->getFullName());
                        }
                    }
                }

                // Fault in the value if needed, and bump the att count
                if ((defType == XMLAttDef::Default)
                ||  (defType == XMLAttDef::Fixed))
                {
                    // Let the validator pass judgement on the attribute value
                    if (fValidate)
                    {
                        fValidator->validateAttrValue
                        (
                            &curDef
                            , curDef.getValue()
                            , false
                            , elemDecl
                        );
                    }

                    XMLAttr* curAtt;
                    if (retCount >= curAttListSize)
                    {
                        if (fDoNamespaces)
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }
                        else
                        {
                            curAtt = new (fMemoryManager) XMLAttr
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                                , false
                                , fMemoryManager
                            );
                        }

                        fAttrList->addElement(curAtt);
                    }
                    else
                    {
                        curAtt = fAttrList->elementAt(retCount);
                        if (fDoNamespaces)
                        {
                            curAtt->set
                            (
                                fEmptyNamespaceId
                                , curDef.getFullName()
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        else
                        {
                            curAtt->set
                            (
                                0
                                , curDef.getFullName()
                                , XMLUni::fgZeroLenString
                                , curDef.getValue()
                                , curDef.getType()
                            );
                        }
                        curAtt->setSpecified(false);
                    }

                    if (fDoNamespaces)
                    {
                        //  Map the new attribute's prefix to a URI id and store
                        //  that in the attribute object.
                        const XMLCh* attPrefix = curAtt->getPrefix();
                        if (attPrefix && *attPrefix) {
                            curAtt->setURIId
                            (
                                resolvePrefix(attPrefix, ElemStack::Mode_Attribute)
                            );
                        }
                    }

                    retCount++;
                }
            }
        }
    }

    return retCount;
}